

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info)

{
  deUint32 dVar1;
  int iVar2;
  int height;
  int depth;
  IVec3 *v;
  size_type sVar3;
  const_reference this;
  void *data_00;
  ConstPixelBufferAccess local_80;
  undefined1 local_48 [8];
  IVec3 levelSize;
  int level;
  IVec3 size;
  TextureFormat format;
  ImageInfo *info_local;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *data_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *result;
  
  dVar1 = ImageInfo::getFormat(info);
  size.m_data._4_8_ = glu::mapGLInternalFormat(dVar1);
  v = ImageInfo::getSize(info);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&level,v);
  levelSize.m_data[2]._3_1_ = 0;
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            (__return_storage_ptr__);
  for (levelSize.m_data[1] = 0; iVar2 = levelSize.m_data[1],
      sVar3 = std::
              vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              ::size(data), iVar2 < (int)sVar3; levelSize.m_data[1] = levelSize.m_data[1] + 1) {
    dVar1 = ImageInfo::getTarget(info);
    getLevelSize((anon_unknown_0 *)local_48,dVar1,(IVec3 *)&level,levelSize.m_data[1]);
    iVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_48);
    height = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_48);
    depth = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_48);
    this = std::
           vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ::operator[](data,(long)levelSize.m_data[1]);
    data_00 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(this);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_80,(TextureFormat *)(size.m_data + 1),iVar2,height,depth,data_00);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
    push_back(__return_storage_ptr__,&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getLevelAccesses (const vector<ArrayBuffer<deUint8> >& data, const ImageInfo& info)
{
	const tcu::TextureFormat			format	= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size	= info.getSize();

	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), size, level);

		result.push_back(tcu::ConstPixelBufferAccess(format, levelSize.x(), levelSize.y(), levelSize.z(), data[level].getPtr()));
	}

	return result;
}